

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_byteArray_primitive_copyFromUntil
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  sysbvm_tuple_t *psVar1;
  sysbvm_tuple_t type;
  sysbvm_object_tuple_t *psVar2;
  ulong uVar3;
  ulong uVar4;
  ulong immediateTypeTag;
  size_t byteSize;
  sysbvm_type_tuple_t *arrayTypeObject;
  ulong uVar5;
  
  if (argumentCount != 3) {
    sysbvm_error_argumentCountMismatch(3,argumentCount);
  }
  psVar1 = (sysbvm_tuple_t *)*arguments;
  immediateTypeTag = (ulong)psVar1 & 0xf;
  if (immediateTypeTag != 0 || psVar1 == (sysbvm_tuple_t *)0x0) {
    uVar5 = 0;
  }
  else {
    uVar5 = (ulong)*(uint *)((long)psVar1 + 0xc);
  }
  uVar4 = arguments[1];
  if (uVar4 == 0 || (uVar4 & 0xf) != 0) {
    uVar4 = (long)uVar4 >> 4;
  }
  else {
    uVar4 = *(ulong *)(uVar4 + 0x10);
  }
  uVar3 = arguments[2];
  if (uVar3 == 0 || (uVar3 & 0xf) != 0) {
    uVar3 = (long)uVar3 >> 4;
  }
  else {
    uVar3 = *(ulong *)(uVar3 + 0x10);
  }
  if (uVar3 < uVar5) {
    uVar5 = uVar3;
  }
  if (immediateTypeTag != 0 || psVar1 == (sysbvm_tuple_t *)0x0) {
    if ((int)immediateTypeTag == 0xf) {
      type = sysbvm_tuple_getImmediateTrivialTypeWithIndex(context,(ulong)psVar1 >> 4);
    }
    else {
      type = sysbvm_tuple_getImmediateTypeWithTag(context,immediateTypeTag);
    }
  }
  else {
    type = *psVar1;
  }
  if (uVar4 < uVar5) {
    byteSize = 0;
    if (uVar4 <= uVar5) {
      byteSize = uVar5 - uVar4;
    }
    psVar2 = sysbvm_context_allocateByteTuple(context,type,byteSize);
    memcpy(&psVar2->field_1,(void *)(uVar4 + 0x10 + (long)psVar1),byteSize);
  }
  else {
    psVar2 = *(sysbvm_object_tuple_t **)(type + 0x78);
    if (psVar2 == (sysbvm_object_tuple_t *)0x0) {
      psVar2 = sysbvm_context_allocateByteTuple(context,type,0);
      *(sysbvm_object_tuple_t **)(type + 0x78) = psVar2;
    }
  }
  return (sysbvm_tuple_t)psVar2;
}

Assistant:

static sysbvm_tuple_t sysbvm_byteArray_primitive_copyFromUntil(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 3) sysbvm_error_argumentCountMismatch(3, argumentCount);

    sysbvm_byteArray_t *array = (sysbvm_byteArray_t *)arguments[0];
    size_t size = sysbvm_tuple_getSizeInBytes(arguments[0]);
    size_t startIndex = sysbvm_tuple_size_decode(arguments[1]);
    size_t endIndex = sysbvm_tuple_size_decode(arguments[2]);
    if(endIndex >= size)
        endIndex = size;
    
    size_t copySize = startIndex <= endIndex ? endIndex - startIndex : 0;
    sysbvm_tuple_t arrayType = sysbvm_tuple_getType(context, arguments[0]);

    if(copySize == 0)
    {
        sysbvm_type_tuple_t *arrayTypeObject = (sysbvm_type_tuple_t*)arrayType;
        if(!arrayTypeObject->emptyTrivialSingleton)
            arrayTypeObject->emptyTrivialSingleton = (sysbvm_tuple_t)sysbvm_context_allocateByteTuple(context, arrayType, 0);
        return arrayTypeObject->emptyTrivialSingleton;
    }

    sysbvm_byteArray_t *copy = (sysbvm_byteArray_t *)sysbvm_context_allocateByteTuple(context, arrayType, copySize);

    memcpy(copy->elements, array->elements + startIndex, copySize);
    return (sysbvm_tuple_t)copy;
}